

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxExpression::EmitCompare
          (FxExpression *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ExpEmit EVar4;
  int opcode;
  ExpEmit op;
  size_t local_40;
  ExpEmit local_38;
  undefined4 extraout_var;
  
  EVar4._0_4_ = (*this->_vptr_FxExpression[9])();
  EVar4.Konst = (bool)(char)extraout_var;
  EVar4.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar4.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar4.Target = (bool)(char)((uint)extraout_var >> 0x18);
  cVar1 = (char)(EVar4._0_4_ >> 0x10);
  op = EVar4;
  if ((cVar1 == -0x80) || (((ulong)EVar4 & 0x1ff000000) != 0x1000000)) {
    __assert_fail("op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x13c,
                  "virtual void FxExpression::EmitCompare(VMFunctionBuilder *, bool, TArray<size_t> &, TArray<size_t> &)"
                 );
  }
  switch(cVar1) {
  case '\0':
    uVar2 = (uint)!invert;
    uVar3 = VMFunctionBuilder::GetConstantInt(build,0);
    opcode = 0x8a;
    break;
  case '\x01':
    uVar2 = (uint)!invert;
    uVar3 = VMFunctionBuilder::GetConstantFloat(build,0.0);
    opcode = 0xae;
    break;
  case '\x02':
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    uVar3 = uVar3 & 0xffff;
    local_38.Konst = false;
    local_38.Fixed = false;
    local_38.Final = false;
    local_38.Target = false;
    local_38._0_4_ = uVar3 + 0x1000000;
    VMFunctionBuilder::Emit(build,0x58,uVar3,(VM_SHALF)EVar4._0_4_);
    uVar2 = VMFunctionBuilder::GetConstantInt(build,0);
    VMFunctionBuilder::Emit(build,0x8a,(uint)!invert,uVar3,uVar2);
    ExpEmit::Free(&local_38,build);
    goto switchD_00506c85_default;
  case '\x03':
    uVar2 = (uint)!invert;
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\0');
    opcode = 0xd0;
    break;
  default:
    goto switchD_00506c85_default;
  }
  VMFunctionBuilder::Emit(build,opcode,uVar2,EVar4._0_4_ & 0xffff,uVar3);
switchD_00506c85_default:
  local_40 = VMFunctionBuilder::Emit(build,0x44,0);
  TArray<unsigned_long,_unsigned_long>::Push(patchspots_no,&local_40);
  ExpEmit::Free(&op,build);
  return;
}

Assistant:

void FxExpression::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit op = Emit(build);
	ExpEmit i;
	assert(op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst);
	switch (op.RegType)
	{
	case REGT_INT:
		build->Emit(OP_EQ_K, !invert, op.RegNum, build->GetConstantInt(0));
		break;

	case REGT_FLOAT:
		build->Emit(OP_EQF_K, !invert, op.RegNum, build->GetConstantFloat(0));
		break;

	case REGT_POINTER:
		build->Emit(OP_EQA_K, !invert, op.RegNum, build->GetConstantAddress(0, ATAG_GENERIC));
		break;

	case REGT_STRING:
		i = ExpEmit(build, REGT_INT);
		build->Emit(OP_LENS, i.RegNum, op.RegNum);
		build->Emit(OP_EQ_K, !invert, i.RegNum, build->GetConstantInt(0));
		i.Free(build);
		break;

	default:
		break;
	}
	patchspots_no.Push(build->Emit(OP_JMP, 0));
	op.Free(build);
}